

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall
SQCompiler::ResolveContinues
          (SQCompiler *this,SQFuncState *funcstate,SQInteger ntoresolve,SQInteger targetpos)

{
  SQUnsignedInteger SVar1;
  long pos;
  ulong uVar2;
  
  if (0 < ntoresolve) {
    uVar2 = ntoresolve + 1;
    do {
      SVar1 = (funcstate->_unresolvedcontinues)._size;
      pos = (funcstate->_unresolvedcontinues)._vals[SVar1 - 1];
      (funcstate->_unresolvedcontinues)._size = SVar1 - 1;
      SQFuncState::SetInstructionParams(funcstate,pos,0,targetpos - pos,0,0);
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

void ResolveContinues(SQFuncState *funcstate, SQInteger ntoresolve, SQInteger targetpos)
    {
        while(ntoresolve > 0) {
            SQInteger pos = funcstate->_unresolvedcontinues.back();
            funcstate->_unresolvedcontinues.pop_back();
            //set the jmp instruction
            funcstate->SetInstructionParams(pos, 0, targetpos - pos, 0);
            ntoresolve--;
        }
    }